

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIListBox::setSpriteBank(CGUIListBox *this,IGUISpriteBank *bank)

{
  long in_RSI;
  IReferenceCounted *in_RDI;
  
  if (in_RSI != *(long *)&in_RDI[0xf].ReferenceCounter) {
    if (*(long *)&in_RDI[0xf].ReferenceCounter != 0) {
      IReferenceCounted::drop(in_RDI);
    }
    *(long *)&in_RDI[0xf].ReferenceCounter = in_RSI;
    if (*(long *)&in_RDI[0xf].ReferenceCounter != 0) {
      IReferenceCounted::grab
                ((IReferenceCounted *)
                 ((long)*(long **)&in_RDI[0xf].ReferenceCounter +
                 *(long *)(**(long **)&in_RDI[0xf].ReferenceCounter + -0x18)));
    }
  }
  return;
}

Assistant:

void CGUIListBox::setSpriteBank(IGUISpriteBank *bank)
{
	if (bank == IconBank)
		return;
	if (IconBank)
		IconBank->drop();

	IconBank = bank;
	if (IconBank)
		IconBank->grab();
}